

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.hpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::Optimization::
Optimization(Optimization *this)

{
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_78;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_63;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_60;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_4b;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_48;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_33;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_30;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_1f [5];
  Optimization *local_10;
  Optimization *this_local;
  
  local_10 = this;
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix(&this->momentaDot);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->positionFlex);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->velocityFlex);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->accelerationFlex);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->orientationFlexV);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->angularVelocityFlex);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->angularAccelerationFlex);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->positionComBias);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rFlex);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rFlexT);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->drift);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->pdrift);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rdrift);
  Eigen::AngleAxis<double>::AngleAxis(&this->orientationAA);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk1dx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xdx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk_fory);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->yk);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->ykdy);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->orinertia);
  Eigen::LLT<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::LLT(&this->invinertia);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rtotal);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->ptotal);
  Eigen::AngleAxis<double>::AngleAxis(&this->aatotal);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->oritotal);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Jx);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Jy);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rimu);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->imuAcc);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->imuOmega);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->sensorState);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->positionCom);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->velocityCom);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->accelerationCom);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->AngMomentum);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->dotAngMomentum);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->positionControl);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->velocityControl);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->accelerationControl);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->orientationControlV);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->angularVelocityControl);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->rControl);
  IndexedMatrixArray::IndexedMatrixArray(&this->contactPosV);
  IndexedMatrixArray::IndexedMatrixArray(&this->contactOriV);
  IndexedMatrixArray::IndexedMatrixArray(&this->contactVelArray);
  IndexedMatrixArray::IndexedMatrixArray(&this->contactAngVelArray);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->inertia);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->dotInertia);
  IndexedMatrixArray::IndexedMatrixArray(&this->efforts);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->f);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->fi);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->t);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->fm);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->tm);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->linearAcceleration);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->angularAcceleration);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->vf);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->vt);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->crosstempV);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->crosstempM);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Rci);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Rcit);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->contactPos);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->contactVel);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->RciContactPos);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->globalContactPos);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Rt);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->forcei);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->momenti);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->addForce);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->addMoment);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->skewV);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->skewV2);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->skewVR);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->skewV2R);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->RIRT);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->wx2Rc);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->_2wxRv);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->Ra);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->Rc);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->Rcp);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->curRotation0,local_1f);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->orientationVector0,&local_30);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->curRotation1,&local_33);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->orientationVector1,&local_48);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->curRotation2,&local_4b);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->orientationVector2,&local_60);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->curRotation3,&local_63);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->orientationVector3,&local_78);
  return;
}

Assistant:

Optimization()
          :
          curRotation0(Matrix3::Identity()),
          orientationVector0(Vector3::Zero()),
          curRotation1(Matrix3::Identity()),
          orientationVector1(Vector3::Zero()),
          curRotation2(Matrix3::Identity()),
          orientationVector2(Vector3::Zero()),
          curRotation3(Matrix3::Identity()),
          orientationVector3(Vector3::Zero())
        {}